

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O3

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_S
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TQualifierIndex pCVar2;
  CQualifier *this_00;
  COperation local_28;
  
  this_00 = qualifier;
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    local_28.type = saveInTable + OT_MatchRight_S;
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
  }
  else {
    pCVar2 = registerQualifier((COperationsBuilder *)this_00,qualifier);
    local_28.type = saveInTable + OT_MatchRightWithQualifier_S;
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
    (((this->operations).last)->super_COperation).field_1.qualifier = pCVar2;
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_S( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchRightSaveToTable_S : OT_MatchRight_S ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchRightWithQualifierSaveToTable_S :
			 OT_MatchRightWithQualifier_S ), qualifier );
	}
}